

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O2

X509 * find_issuer(X509_STORE_CTX *ctx,stack_st_X509 *sk,X509 *x)

{
  int iVar1;
  size_t sVar2;
  X509 *issuer;
  ulong i;
  
  i = 0;
  do {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)sk);
    if (sVar2 <= i) {
      return (X509 *)0x0;
    }
    issuer = (X509 *)OPENSSL_sk_value((OPENSSL_STACK *)sk,i);
    iVar1 = x509_check_issued_with_callback(ctx,x,issuer);
    i = i + 1;
  } while (iVar1 == 0);
  return issuer;
}

Assistant:

static X509 *find_issuer(X509_STORE_CTX *ctx, STACK_OF(X509) *sk, X509 *x) {
  size_t i;
  X509 *issuer;
  for (i = 0; i < sk_X509_num(sk); i++) {
    issuer = sk_X509_value(sk, i);
    if (x509_check_issued_with_callback(ctx, x, issuer)) {
      return issuer;
    }
  }
  return NULL;
}